

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall LineReader::ReadLine(LineReader *this,char **line_start,char **line_end)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *__ptr;
  char *__dest;
  
  pcVar3 = this->buf_end_;
  if ((this->line_start_ < pcVar3) && (this->line_end_ != (char *)0x0)) {
    __ptr = this->line_end_ + 1;
    this->line_start_ = __ptr;
  }
  else {
    __ptr = this->buf_;
    sVar4 = fread(__ptr,1,0x40000,(FILE *)this->file_);
    if (sVar4 == 0) {
      return false;
    }
    this->line_start_ = __ptr;
    pcVar3 = __ptr + sVar4;
    this->buf_end_ = pcVar3;
  }
  sVar4 = (long)pcVar3 - (long)__ptr;
  pcVar1 = (char *)memchr(__ptr,10,sVar4);
  this->line_end_ = pcVar1;
  __dest = __ptr;
  if (pcVar1 == (char *)0x0) {
    __dest = this->buf_;
    memmove(__dest,__ptr,sVar4);
    sVar2 = fread(pcVar3 + ((long)__dest - (long)__ptr),1,0x40000 - sVar4,(FILE *)this->file_);
    this->buf_end_ = pcVar3 + ((long)__dest - (long)__ptr) + sVar2;
    this->line_start_ = __dest;
    pcVar3 = (char *)memchr(__dest,10,sVar4 + sVar2);
    this->line_end_ = pcVar3;
  }
  *line_start = __dest;
  *line_end = this->line_end_;
  return true;
}

Assistant:

bool ReadLine(char** line_start, char** line_end) {
    if (line_start_ >= buf_end_ || !line_end_) {
      // Buffer empty, refill.
      size_t size_read = fread(buf_, 1, sizeof(buf_), file_);
      if (!size_read)
        return false;
      line_start_ = buf_;
      buf_end_ = buf_ + size_read;
    } else {
      // Advance to next line in buffer.
      line_start_ = line_end_ + 1;
    }

    line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    if (!line_end_) {
      // No newline. Move rest of data to start of buffer, fill rest.
      size_t already_consumed = line_start_ - buf_;
      size_t size_rest = (buf_end_ - buf_) - already_consumed;
      memmove(buf_, line_start_, size_rest);

      size_t read = fread(buf_ + size_rest, 1, sizeof(buf_) - size_rest, file_);
      buf_end_ = buf_ + size_rest + read;
      line_start_ = buf_;
      line_end_ = (char*)memchr(line_start_, '\n', buf_end_ - line_start_);
    }

    *line_start = line_start_;
    *line_end = line_end_;
    return true;
  }